

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall
Catch::TeamCityReporter::testCaseStarting(TeamCityReporter *this,TestCaseInfo *testInfo)

{
  ostream *poVar1;
  TestCaseInfo *in_RSI;
  StreamingReporterBase *in_RDI;
  undefined1 in_stack_000001f0 [16];
  string *in_stack_ffffffffffffff88;
  string local_30 [32];
  TestCaseInfo *local_10;
  
  local_10 = in_RSI;
  Timer::start((Timer *)in_RDI);
  StreamingReporterBase::testCaseStarting(in_RDI,local_10);
  poVar1 = std::operator<<((in_RDI->super_ReporterBase).m_stream,"##teamcity[testStarted name=\'");
  StringRef::StringRef((StringRef *)in_RDI,in_stack_ffffffffffffff88);
  (anonymous_namespace)::escape_abi_cxx11_((StringRef)in_stack_000001f0);
  poVar1 = std::operator<<(poVar1,local_30);
  std::operator<<(poVar1,"\']\n");
  std::__cxx11::string::~string(local_30);
  std::ostream::flush();
  return;
}

Assistant:

void TeamCityReporter::testCaseStarting(TestCaseInfo const& testInfo) {
        m_testTimer.start();
        StreamingReporterBase::testCaseStarting(testInfo);
        m_stream << "##teamcity[testStarted name='"
            << escape(testInfo.name) << "']\n";
        m_stream.flush();
    }